

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestLocusPerpIntersect.cpp
# Opt level: O0

bool ParseLocusPerpIntercept2
               (string *sLine2,string *sAzFromTestPtToIntercept,string *sDistFromTestPtToIntercept,
               string *sInterceptLat,string *sInterceptLon)

{
  bool bVar1;
  syntax_option_type __f;
  value_type *pvVar2;
  regex_error *e;
  string_type local_3f0;
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  local_3d0;
  string_type local_348;
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  local_328;
  string_type local_2a0;
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  local_280;
  string_type local_1f8;
  undefined1 local_1d8 [8];
  sregex_token_iterator s_end;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_148;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_140;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_138;
  undefined1 local_130 [8];
  sregex_token_iterator it;
  int sub_matches [4];
  regex pat;
  undefined1 local_70 [8];
  string sRxPat;
  syntax_option_type flags;
  bool bPassed;
  string *sInterceptLon_local;
  string *sInterceptLat_local;
  string *sDistFromTestPtToIntercept_local;
  string *sAzFromTestPtToIntercept_local;
  string *sLine2_local;
  
  trim(sLine2," \t\n\r\f\v");
  __f = std::regex_constants::operator|(1,0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_70,"[,][0-9A-z ]+[,]",
             (allocator *)
             ((long)&pat._M_automaton.
                     super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + 7));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&pat._M_automaton.
                     super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + 7));
  std::__cxx11::string::operator+=
            ((string *)local_70,"([-+]?[0-9]*[.]?[0-9]+)[,]([-+]?[0-9]*[.]?[0-9]+)[,]");
  std::__cxx11::string::operator+=
            ((string *)local_70,
             "([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[NS])[,]([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[WE])");
  std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
  basic_regex<std::char_traits<char>,std::allocator<char>>
            ((basic_regex<char,std::__cxx11::regex_traits<char>> *)(sub_matches + 2),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,__f);
  it._M_has_m1 = true;
  it._129_7_ = 0x2000000;
  sub_matches[0] = 3;
  sub_matches[1] = 4;
  local_140._M_current = (char *)std::__cxx11::string::begin();
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_138,&local_140);
  s_end._128_8_ = std::__cxx11::string::end();
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_148,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&s_end._M_has_m1);
  std::__cxx11::
  regex_token_iterator<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char,std::__cxx11::regex_traits<char>>
  ::regex_token_iterator<4ul>
            ((regex_token_iterator<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char,std::__cxx11::regex_traits<char>>
              *)local_130,local_138,local_148,(regex_type *)(sub_matches + 2),
             (int (*) [4])&it._M_has_m1,0);
  std::__cxx11::
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  ::regex_token_iterator
            ((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
              *)local_1d8);
  bVar1 = std::__cxx11::
          regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
          ::operator!=((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                        *)local_130,
                       (regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                        *)local_1d8);
  if (bVar1) {
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++(&local_280,
                 (regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)local_130,0);
    pvVar2 = std::__cxx11::
             regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
             ::operator*(&local_280);
    std::__cxx11::sub_match::operator_cast_to_string(&local_1f8,(sub_match *)pvVar2);
    std::__cxx11::string::operator=((string *)sAzFromTestPtToIntercept,(string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator(&local_280);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++(&local_328,
                 (regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)local_130,0);
    pvVar2 = std::__cxx11::
             regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
             ::operator*(&local_328);
    std::__cxx11::sub_match::operator_cast_to_string(&local_2a0,(sub_match *)pvVar2);
    std::__cxx11::string::operator=((string *)sDistFromTestPtToIntercept,(string *)&local_2a0);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator(&local_328);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++(&local_3d0,
                 (regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)local_130,0);
    pvVar2 = std::__cxx11::
             regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
             ::operator*(&local_3d0);
    std::__cxx11::sub_match::operator_cast_to_string(&local_348,(sub_match *)pvVar2);
    std::__cxx11::string::operator=((string *)sInterceptLat,(string *)&local_348);
    std::__cxx11::string::~string((string *)&local_348);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator(&local_3d0);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::operator++((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                  *)&e,(regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                        *)local_130,0);
    pvVar2 = std::__cxx11::
             regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
             ::operator*((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                          *)&e);
    std::__cxx11::sub_match::operator_cast_to_string(&local_3f0,(sub_match *)pvVar2);
    std::__cxx11::string::operator=((string *)sInterceptLon,(string *)&local_3f0);
    std::__cxx11::string::~string((string *)&local_3f0);
    std::__cxx11::
    regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
    ::~regex_token_iterator
              ((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
                *)&e);
  }
  std::__cxx11::
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  ::~regex_token_iterator
            ((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
              *)local_1d8);
  std::__cxx11::
  regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
  ::~regex_token_iterator
            ((regex_token_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char,_std::__cxx11::regex_traits<char>_>
              *)local_130);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)(sub_matches + 2));
  std::__cxx11::string::~string((string *)local_70);
  return bVar1;
}

Assistant:

bool ParseLocusPerpIntercept2(string sLine2, string &sAzFromTestPtToIntercept, string &sDistFromTestPtToIntercept,
                              string &sInterceptLat, string &sInterceptLon)
{
    bool bPassed = false;
    trim(sLine2);

    try
    {
        regex_constants::syntax_option_type flags = regex_constants::icase | regex_constants::ECMAScript;

        string sRxPat = "[,][0-9A-z ]+[,]";
        sRxPat += "([-+]?[0-9]*[.]?[0-9]+)[,]([-+]?[0-9]*[.]?[0-9]+)[,]";
        sRxPat += "([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[NS])[,]([0-9]*[:][0-9]*[:][0-9]*[.][0-9]*[WE])";


        regex pat(sRxPat, flags);
        int const sub_matches[] = {1, 2, 3, 4,};
        sregex_token_iterator it(sLine2.begin(), sLine2.end(), pat, sub_matches);
        sregex_token_iterator s_end;
        if (it != s_end)
        {
            sAzFromTestPtToIntercept = *it++;
            sDistFromTestPtToIntercept = *it++;
            sInterceptLat = *it++;
            sInterceptLon = *it++;
            bPassed = true;
        }
    }
    catch (regex_error &e)
    {
        cout << "\n" << e.what();
        return false;
    }

    return bPassed;
}